

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

void cppcms::json::details::generic_append<cppcms::json::details::string_append>
               (char *begin,char *end,string_append *a)

{
  byte bVar1;
  byte *pbVar2;
  char buf [8];
  
  std::__cxx11::string::push_back((char)a->out);
  pbVar2 = (byte *)begin;
  if (begin != end) {
    do {
      bVar1 = *pbVar2;
      switch(bVar1) {
      case 8:
        break;
      case 9:
        break;
      case 10:
        break;
      case 0xb:
switchD_0010bf31_caseD_b:
        if (bVar1 < 0x20) break;
        goto LAB_0010bfbe;
      case 0xc:
        break;
      case 0xd:
        break;
      default:
        if ((bVar1 != 0x22) && (bVar1 != 0x5c)) goto switchD_0010bf31_caseD_b;
      }
      std::__cxx11::string::append((char *)a->out,(ulong)begin);
      std::__cxx11::string::append((char *)a->out);
      begin = (char *)(pbVar2 + 1);
LAB_0010bfbe:
      pbVar2 = pbVar2 + 1;
    } while (pbVar2 != (byte *)end);
  }
  std::__cxx11::string::append((char *)a->out,(ulong)begin);
  std::__cxx11::string::push_back((char)a->out);
  return;
}

Assistant:

void generic_append(char const *begin,char const *end,Appender &a)
		{
			a.append('"');
			char const *i,*last;
			char buf[8] = "\\u00";
			for(i=begin,last = begin;i!=end;) {
				char const *addon = 0;
				unsigned char c=*i;
				switch(c) {
				case 0x22: addon = "\\\""; break;
				case 0x5C: addon = "\\\\"; break;
				case '\b': addon = "\\b"; break;
				case '\f': addon = "\\f"; break;
				case '\n': addon = "\\n"; break;
				case '\r': addon = "\\r"; break;
				case '\t': addon = "\\t"; break;
				default:
					if(c<=0x1F) {
						static char const tohex[]="0123456789abcdef";
						buf[4]=tohex[c >>  4];
						buf[5]=tohex[c & 0xF];
						buf[6]=0;
						addon = buf;
					}
				};
				if(addon) {
					a.append(last,i-last);
					a.append(addon);
					i++;
					last = i;
				}
				else {
					i++;
				}
			}
			a.append(last,i-last);
			a.append('"');
		}